

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op2d.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
backtrack(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
         vector<unsigned_int,_std::allocator<unsigned_int>_> *cp_raw)

{
  uint x;
  uint local_1c;
  
  local_1c = (cp_raw->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish[-1];
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; local_1c != 0;
      local_1c = (cp_raw->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[local_1c]) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_1c);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

vector<unsigned int> backtrack(vector<unsigned int> cp_raw) {
  /* @brief  backtrack the changepoint vector */
  unsigned int x = cp_raw[cp_raw.size() - 1];
  vector<unsigned int> cp;
  while (x > 0) {
    cp.push_back(x);
    x = cp_raw[x];
  }
  reverse(cp.begin(), cp.end());
  return cp;
}